

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffer.cpp
# Opt level: O3

void helics::bufferToJson(LogBuffer *buffer,json *base)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  data local_40;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,(initializer_list_t)ZEXT816(0),false,array);
  pvVar3 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)base,"logs");
  vVar1 = (pvVar3->m_data).m_type;
  (pvVar3->m_data).m_type = local_40.m_type;
  jVar2 = (pvVar3->m_data).m_value;
  (pvVar3->m_data).m_value = local_40.m_value;
  local_40.m_type = vVar1;
  local_40.m_value = jVar2;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_40);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/common/LogBuffer.cpp:67:20)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/common/LogBuffer.cpp:67:20)>
             ::_M_manager;
  local_30._M_unused._M_object = base;
  LogBuffer::process(buffer,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                             *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)((_Any_data *)&local_30,(_Any_data *)&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void bufferToJson(const LogBuffer& buffer, nlohmann::json& base)
{
    base["logs"] = nlohmann::json::array();
    buffer.process([&base](int level, std::string_view header, std::string_view message) {
        nlohmann::json logBlock;
        logBlock["level"] = level;
        logBlock["header"] = std::string(header);
        logBlock["message"] = std::string(message);
        base["logs"].push_back(std::move(logBlock));
    });
}